

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiOldColumns *pIVar6;
  ImGuiOldColumnFlags in_EDX;
  int in_ESI;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImGuiID unaff_retaddr;
  ImGuiWindow *in_stack_00000008;
  float width;
  float offset_1;
  float offset_0;
  float clip_x2;
  float clip_x1;
  ImGuiOldColumnData *column_1;
  int n_1;
  ImGuiOldColumnData column;
  int n;
  float max_2;
  float max_1;
  float half_clip_extend_x;
  float column_padding;
  ImGuiOldColumns *columns;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  float y1;
  float in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImGuiOldColumnData *in_stack_ffffffffffffff90;
  int local_64;
  int local_44;
  
  pIVar4 = GImGui;
  pIVar5 = GetCurrentWindow();
  GetColumnsID((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int)in_stack_ffffffffffffff7c);
  pIVar6 = FindOrCreateColumns(in_stack_00000008,unaff_retaddr);
  pIVar6->Current = 0;
  pIVar6->Count = in_ESI;
  pIVar6->Flags = in_EDX;
  (pIVar5->DC).CurrentColumns = pIVar6;
  pIVar6->HostCursorPosY = (pIVar5->DC).CursorPos.y;
  pIVar6->HostCursorMaxPosX = (pIVar5->DC).CursorMaxPos.x;
  (pIVar6->HostInitialClipRect).Min = (pIVar5->ClipRect).Min;
  (pIVar6->HostInitialClipRect).Max = (pIVar5->ClipRect).Max;
  (pIVar6->HostBackupParentWorkRect).Min = (pIVar5->ParentWorkRect).Min;
  (pIVar6->HostBackupParentWorkRect).Max = (pIVar5->ParentWorkRect).Max;
  (pIVar5->ParentWorkRect).Min = (pIVar5->WorkRect).Min;
  (pIVar5->ParentWorkRect).Max = (pIVar5->WorkRect).Max;
  fVar1 = (pIVar4->Style).ItemSpacing.x;
  fVar7 = ImMax<float>((pIVar5->WindowPadding).x * 0.5,pIVar5->WindowBorderSize);
  fVar8 = ImFloor(fVar7);
  fVar11 = (pIVar5->WorkRect).Max.x + fVar1;
  fVar9 = ImMax<float>(fVar1 - (pIVar5->WindowPadding).x,0.0);
  fVar9 = fVar11 - fVar9;
  fVar7 = (pIVar5->WorkRect).Max.x;
  y1 = (pIVar5->DC).Indent.x - fVar1;
  fVar10 = ImMax<float>(fVar1 - (pIVar5->WindowPadding).x,0.0);
  pIVar6->OffMinX = y1 + fVar10;
  fVar7 = ImMin<float>(fVar9,fVar7 + fVar8);
  fVar7 = ImMax<float>(fVar7 - (pIVar5->Pos).x,pIVar6->OffMinX + 1.0);
  pIVar6->OffMaxX = fVar7;
  fVar7 = (pIVar5->DC).CursorPos.y;
  pIVar6->LineMaxY = fVar7;
  pIVar6->LineMinY = fVar7;
  if (((pIVar6->Columns).Size != 0) && ((pIVar6->Columns).Size != in_ESI + 1)) {
    ImVector<ImGuiOldColumnData>::resize
              ((ImVector<ImGuiOldColumnData> *)CONCAT44(fVar11,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  }
  pIVar6->IsFirstFrame = (pIVar6->Columns).Size == 0;
  if ((pIVar6->Columns).Size == 0) {
    ImVector<ImGuiOldColumnData>::reserve
              ((ImVector<ImGuiOldColumnData> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int)in_stack_ffffffffffffff6c);
    for (local_44 = 0; local_44 < in_ESI + 1; local_44 = local_44 + 1) {
      ImGuiOldColumnData::ImGuiOldColumnData
                ((ImGuiOldColumnData *)CONCAT44(fVar11,in_stack_ffffffffffffff60));
      ImVector<ImGuiOldColumnData>::push_back
                ((ImVector<ImGuiOldColumnData> *)CONCAT44(fVar11,in_stack_ffffffffffffff60),
                 (ImGuiOldColumnData *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                );
    }
  }
  for (local_64 = 0; local_64 < in_ESI; local_64 = local_64 + 1) {
    in_stack_ffffffffffffff90 = ImVector<ImGuiOldColumnData>::operator[](&pIVar6->Columns,local_64);
    fVar7 = (pIVar5->Pos).x;
    fVar9 = GetColumnOffset(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff8c = (float)(int)(fVar7 + fVar9 + 0.5);
    fVar7 = (pIVar5->Pos).x;
    fVar9 = GetColumnOffset(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff88 = (float)(int)(((fVar7 + fVar9) - 1.0) + 0.5);
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,y1,fVar11,fVar7);
    IVar2.y = in_stack_ffffffffffffff7c;
    IVar2.x = in_stack_ffffffffffffff78;
    (in_stack_ffffffffffffff90->ClipRect).Min = IVar2;
    IVar3.y = in_stack_ffffffffffffff84;
    IVar3.x = in_stack_ffffffffffffff80;
    (in_stack_ffffffffffffff90->ClipRect).Max = IVar3;
    ImRect::ClipWithFull
              ((ImRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (ImRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (1 < pIVar6->Count) {
    ImDrawListSplitter::Split
              ((ImDrawListSplitter *)in_stack_ffffffffffffff90,
               (ImDrawList *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (int)in_stack_ffffffffffffff84);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (ImDrawList *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74);
    PushColumnClipRect(in_stack_ffffffffffffff74);
  }
  fVar7 = GetColumnOffset(in_stack_ffffffffffffff70);
  fVar11 = GetColumnOffset(in_stack_ffffffffffffff70);
  PushItemWidth(fVar7);
  fVar7 = ImMax<float>(fVar1 - (pIVar5->WindowPadding).x,0.0);
  (pIVar5->DC).ColumnsOffset.x = fVar7;
  (pIVar5->DC).CursorPos.x =
       (float)(int)((pIVar5->Pos).x + (pIVar5->DC).Indent.x + (pIVar5->DC).ColumnsOffset.x);
  (pIVar5->WorkRect).Max.x = ((pIVar5->Pos).x + fVar11) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}